

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Write.cpp
# Opt level: O2

void __thiscall
idx2::WriteChunkExponents
          (idx2 *this,idx2_file *Idx2,encode_data *E,sub_channel *Sc,i8 Level,i8 Subband)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  undefined8 uVar6;
  void *__src;
  ulong *puVar7;
  bool bVar8;
  char Level_00;
  bucket_status *pbVar9;
  byte bVar10;
  uint uVar11;
  unsigned_long *puVar12;
  long lVar13;
  long lVar14;
  byte *pbVar15;
  uint uVar16;
  ulong uVar17;
  undefined8 in_XMM0_Qa;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined8 in_XMM2_Qb;
  iterator CemIt;
  file_id FileId;
  chunk_exp_info ChunkExpInfo;
  
  Level_00 = (char)Sc;
  pbVar9 = (E->Channels).Stats;
  uVar6 = (E->Channels).Size;
  *(undefined8 *)pbVar9 = uVar6;
  uVar16 = (uint)(E->Channels).LogCapacity;
  if (0 < (int)uVar16 >> 3) {
    (E->Channels).Size = ((ulong)uVar6 >> 1) >> (((byte)uVar16 & 0xf8) - 1 & 0x3f);
  }
  pbVar9 = pbVar9 + ((int)uVar16 >> 3);
  (E->Channels).Stats = pbVar9;
  *(uint *)&(E->Channels).LogCapacity = uVar16 & 7;
  ChunkExpInfo.ExpSizes.Stream.Data = (byte *)(E->BrickPool).Alloc;
  auVar18._0_8_ =
       (double)(long)(pbVar9 + ((ulong)((uVar16 & 7) != 0) - (long)ChunkExpInfo.ExpSizes.Stream.Data
                               ));
  auVar18._8_8_ = in_XMM0_Qa;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = _ZN4idx2L25UncompressedExpChunksStatE_0;
  auVar1 = vminsd_avx(auVar18,auVar1);
  _ZN4idx2L25UncompressedExpChunksStatE_0 = auVar1._0_8_;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = _ZN4idx2L25UncompressedExpChunksStatE_1;
  auVar1 = vmaxsd_avx(auVar18,auVar2);
  _ZN4idx2L25UncompressedExpChunksStatE_1 = auVar1._0_8_;
  _ZN4idx2L25UncompressedExpChunksStatE_2 = auVar18._0_8_ + _ZN4idx2L25UncompressedExpChunksStatE_2;
  _ZN4idx2L25UncompressedExpChunksStatE_3 = _ZN4idx2L25UncompressedExpChunksStatE_3 + 1;
  _ZN4idx2L25UncompressedExpChunksStatE_4 =
       auVar18._0_8_ * auVar18._0_8_ + _ZN4idx2L25UncompressedExpChunksStatE_4;
  (Idx2->DecodeSubbandSpacings).Arr[10].Buffer.Data =
       (byte *)(Idx2->DecodeSubbandSpacings).Arr[9].Size;
  *(undefined4 *)&(Idx2->DecodeSubbandSpacings).Arr[10].Buffer.Alloc = 0;
  (Idx2->DecodeSubbandSpacings).Arr[10].Buffer.Bytes = 0;
  ChunkExpInfo.ExpSizes.Stream.Alloc = (allocator *)(E->Channels).Vals;
  ChunkExpInfo.ExpSizes.Stream.Bytes =
       (i64)((E->Channels).Stats +
            ((long)(((int)(E->Channels).LogCapacity + 7) / 8) -
            (long)ChunkExpInfo.ExpSizes.Stream.Data));
  CompressBufZstd((buffer *)&ChunkExpInfo,(bitstream *)&(Idx2->DecodeSubbandSpacings).Arr[9].Size);
  auVar19._0_8_ =
       (double)(long)((Idx2->DecodeSubbandSpacings).Arr[10].Buffer.Data +
                     ((long)((*(int *)&(Idx2->DecodeSubbandSpacings).Arr[10].Buffer.Alloc + 7) / 8)
                     - (Idx2->DecodeSubbandSpacings).Arr[9].Size));
  auVar19._8_8_ = in_XMM2_Qb;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = _ZN4idx2L23CompressedExpChunksStatE_0;
  auVar1 = vminsd_avx(auVar19,auVar3);
  _ZN4idx2L23CompressedExpChunksStatE_0 = auVar1._0_8_;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = _ZN4idx2L23CompressedExpChunksStatE_1;
  auVar1 = vmaxsd_avx(auVar19,auVar4);
  _ZN4idx2L23CompressedExpChunksStatE_1 = auVar1._0_8_;
  _ZN4idx2L23CompressedExpChunksStatE_2 = auVar19._0_8_ + _ZN4idx2L23CompressedExpChunksStatE_2;
  _ZN4idx2L23CompressedExpChunksStatE_3 = _ZN4idx2L23CompressedExpChunksStatE_3 + 1;
  _ZN4idx2L23CompressedExpChunksStatE_4 =
       auVar19._0_8_ * auVar19._0_8_ + _ZN4idx2L23CompressedExpChunksStatE_4;
  (E->Channels).Stats = (bucket_status *)(E->BrickPool).Alloc;
  *(undefined4 *)&(E->Channels).LogCapacity = 0;
  (E->Channels).Size = 0;
  puVar12 = (unsigned_long *)(ulong)(uint)(int)Level_00;
  ConstructFilePath(&FileId,(idx2_file *)this,(u64)(E->SubChannels).Keys,Level_00,Level,0);
  Lookup<unsigned_long,idx2::chunk_exp_info>
            (&CemIt,(idx2 *)&(Idx2->DecodeSubbandSpacings).Arr[6].Size,
             (hash_table<unsigned_long,_idx2::chunk_exp_info> *)&FileId.Id,puVar12);
  if ((CemIt.Ht)->Stats[CemIt.Idx] != Occupied) {
    chunk_exp_info::chunk_exp_info(&ChunkExpInfo);
    Mallocator();
    (**(code **)Mallocator::Instance.super_allocator._vptr_allocator)
              (&Mallocator::Instance,&ChunkExpInfo,0x88);
    ChunkExpInfo.ExpSizes.BitPtr = ChunkExpInfo.ExpSizes.Stream.Data;
    ChunkExpInfo.ExpSizes.BitPos = 0;
    ChunkExpInfo.ExpSizes.BitBuf = 0;
    Insert<unsigned_long,idx2::chunk_exp_info>(&CemIt,&FileId.Id,&ChunkExpInfo);
  }
  uVar16 = ((CemIt.Val)->ExpSizes).BitPos;
  lVar13 = ((CemIt.Val)->ExpSizes).Stream.Bytes;
  for (lVar14 = lVar13;
      lVar14 <= (long)(((CemIt.Val)->ExpSizes).BitPtr +
                      ((long)((int)(uVar16 + 7) / 8) - (long)((CemIt.Val)->ExpSizes).Stream.Data) +
                      0xc); lVar14 = (lVar14 * 3) / 2 + 8) {
  }
  if ((lVar13 < lVar14) && (lVar13 < lVar14 + 8)) {
    Mallocator();
    ChunkExpInfo.ExpSizes.Stream.Data = (byte *)0x0;
    ChunkExpInfo.ExpSizes.Stream.Bytes = 0;
    ChunkExpInfo.ExpSizes.Stream.Alloc = &Mallocator::Instance.super_allocator;
    AllocBuf((buffer *)&ChunkExpInfo,lVar14 + 8,((CemIt.Val)->ExpSizes).Stream.Alloc);
    MemCopy((buffer *)CemIt.Val,(buffer *)&ChunkExpInfo,
            (u64)(((CemIt.Val)->ExpSizes).BitPtr +
                 ((long)((((CemIt.Val)->ExpSizes).BitPos + 7) / 8) -
                 (long)((CemIt.Val)->ExpSizes).Stream.Data)));
    ((CemIt.Val)->ExpSizes).BitPtr =
         ChunkExpInfo.ExpSizes.Stream.Data +
         ((long)((CemIt.Val)->ExpSizes).BitPtr - (long)((CemIt.Val)->ExpSizes).Stream.Data);
    DeallocBuf((buffer *)CemIt.Val);
    ((CemIt.Val)->ExpSizes).Stream.Alloc = ChunkExpInfo.ExpSizes.Stream.Alloc;
    ((CemIt.Val)->ExpSizes).Stream.Data = ChunkExpInfo.ExpSizes.Stream.Data;
    ((CemIt.Val)->ExpSizes).Stream.Bytes = ChunkExpInfo.ExpSizes.Stream.Bytes;
    uVar16 = ((CemIt.Val)->ExpSizes).BitPos;
  }
  __src = (void *)(Idx2->DecodeSubbandSpacings).Arr[9].Size;
  uVar17 = ((CemIt.Val)->ExpSizes).BitBuf;
  pbVar15 = (Idx2->DecodeSubbandSpacings).Arr[10].Buffer.Data +
            ((long)((*(int *)&(Idx2->DecodeSubbandSpacings).Arr[10].Buffer.Alloc + 7) / 8) -
            (long)__src);
  do {
    if (0x38 < (int)uVar16) {
      puVar7 = (ulong *)((CemIt.Val)->ExpSizes).BitPtr;
      *puVar7 = uVar17;
      uVar17 = (uVar17 >> 1) >> (((byte)uVar16 & 0xf8) - 1 & 0x3f);
      ((CemIt.Val)->ExpSizes).BitBuf = uVar17;
      ((CemIt.Val)->ExpSizes).BitPtr = (byte *)((ulong)(uVar16 >> 3) + (long)puVar7);
      uVar16 = uVar16 & 7;
    }
    uVar17 = (ulong)((uint)pbVar15 & 0x7f & (uint)bitstream::Masks.Arr[7]) << ((byte)uVar16 & 0x3f)
             | uVar17;
    ((CemIt.Val)->ExpSizes).BitBuf = uVar17;
    uVar11 = uVar16 + 7;
    if (0x37 < (int)uVar16) {
      puVar7 = (ulong *)((CemIt.Val)->ExpSizes).BitPtr;
      *puVar7 = uVar17;
      uVar17 = (((CemIt.Val)->ExpSizes).BitBuf >> 1) >> (((byte)uVar11 & 0xf8) - 1 & 0x3f);
      ((CemIt.Val)->ExpSizes).BitPtr = (byte *)((ulong)(uVar11 >> 3) + (long)puVar7);
      uVar11 = 7;
    }
    uVar17 = (ulong)((byte *)0x7f < pbVar15 & (uint)bitstream::Masks.Arr[1]) <<
             ((byte)uVar11 & 0x3f) | uVar17;
    uVar16 = uVar11 + 1;
    ((CemIt.Val)->ExpSizes).BitBuf = uVar17;
    bVar8 = (byte *)0x7f < pbVar15;
    pbVar15 = (byte *)((ulong)pbVar15 >> 7);
  } while (bVar8);
  ((CemIt.Val)->ExpSizes).BitPos = uVar16;
  pbVar15 = (Idx2->DecodeSubbandSpacings).Arr[10].Buffer.Data +
            ((long)((*(int *)&(Idx2->DecodeSubbandSpacings).Arr[10].Buffer.Alloc + 7) / 8) -
            (long)__src);
  lVar13 = ((CemIt.Val)->FileExpBuffer).Size;
  for (lVar14 = ((CemIt.Val)->FileExpBuffer).Capacity; lVar14 <= (long)(pbVar15 + lVar13);
      lVar14 = (lVar14 * 3) / 2 + 8) {
  }
  GrowCapacity<unsigned_char>(&(CemIt.Val)->FileExpBuffer,lVar14);
  if (lVar13 < ((CemIt.Val)->FileExpBuffer).Buffer.Bytes) {
    memcpy(((CemIt.Val)->FileExpBuffer).Buffer.Data + lVar13,__src,(size_t)pbVar15);
    ((CemIt.Val)->FileExpBuffer).Size = (i64)(pbVar15 + lVar13);
    if (Level_00 < '\x10') {
      puVar12 = (E->SubChannels).Keys;
      iVar5 = *(int *)(this + (long)Level_00 * 4 + 0xa00);
      uVar17 = (ulong)iVar5;
      lVar13 = ((CemIt.Val)->Addrs).Size;
      if (((CemIt.Val)->Addrs).Capacity <= lVar13) {
        GrowCapacity<unsigned_long>(&(CemIt.Val)->Addrs,0);
        lVar13 = ((CemIt.Val)->Addrs).Size;
      }
      lVar14 = 0x3f;
      if (uVar17 != 0) {
        for (; uVar17 >> lVar14 == 0; lVar14 = lVar14 + -1) {
        }
      }
      bVar10 = -(iVar5 == 0) | (byte)lVar14;
      ((CemIt.Val)->Addrs).Size = lVar13 + 1;
      *(ulong *)(((CemIt.Val)->Addrs).Buffer.Data + lVar13 * 8) =
           (long)((int)Level << 0xc) + ((ulong)((uint)Sc & 0xff) << 0x3c) +
           ((ulong)puVar12 >> ((1L << (bVar10 & 0x3f) != uVar17) + bVar10 & 0x3f)) * 0x40000;
      (Idx2->DecodeSubbandSpacings).Arr[10].Buffer.Data =
           (byte *)(Idx2->DecodeSubbandSpacings).Arr[9].Size;
      *(undefined4 *)&(Idx2->DecodeSubbandSpacings).Arr[10].Buffer.Alloc = 0;
      (Idx2->DecodeSubbandSpacings).Arr[10].Buffer.Bytes = 0;
      return;
    }
    __assert_fail("Idx < N",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                  ,0x20c,"t &idx2::stack_array<int, 16>::operator[](int) const [t = int, N = 16]");
  }
  __assert_fail("Idx < Bytes",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Memory.h"
                ,0x165,"byte &idx2::buffer::operator[](i64) const");
}

Assistant:

void
WriteChunkExponents(const idx2_file& Idx2, encode_data* E, sub_channel* Sc, i8 Level, i8 Subband)
{
#if VISUS_IDX2
  if (Idx2.external_write){

    /* brick exponents */
    Flush(&Sc->BrickExpStream);
    UncompressedExpChunksStat.Add((f64)Size(Sc->BrickExpStream));
    Rewind(&E->ChunkExpStream);
    CompressBufZstd(ToBuffer(Sc->BrickExpStream), &E->ChunkExpStream);
    CompressedExpChunksStat.Add((f64)Size(E->ChunkExpStream));
    Rewind(&Sc->BrickExpStream);
    u64 ChunkExpAddress = GetChunkAddress(Idx2, Sc->LastBrick, Level, Subband, ExponentBitPlane_);
    buffer Buf = ToBuffer(E->ChunkExpStream);
    if (!Idx2.external_write(Idx2, Buf, ChunkExpAddress))
      idx2_ExitIf(true, "Write chunk exponent failed\n");
    Rewind(&E->ChunkExpStream);
    return;
  }
#endif

  /* brick exponents */
  Flush(&Sc->BrickExpStream);
  UncompressedExpChunksStat.Add((f64)Size(Sc->BrickExpStream));
  Rewind(&E->ChunkExpStream);
  CompressBufZstd(ToBuffer(Sc->BrickExpStream), &E->ChunkExpStream);
  CompressedExpChunksStat.Add((f64)Size(E->ChunkExpStream));

  /* rewind */
  Rewind(&Sc->BrickExpStream);

  /* write to file */
  file_id FileId = ConstructFilePath(Idx2, Sc->LastBrick, Level, Subband, ExponentBitPlane_);
  /* keep track of the chunk sizes */
  auto CemIt = Lookup(E->ChunkExponents, FileId.Id);
  if (!CemIt)
  {
    chunk_exp_info ChunkExpInfo;
    InitWrite(&ChunkExpInfo.ExpSizes, 128);
    //Init(&ChunkEMaxInfo.FileEMaxBuffer, 128);
    Insert(&CemIt, FileId.Id, ChunkExpInfo);
  }
  chunk_exp_info* Ce = CemIt.Val;
  bitstream* ChunkEMaxSzs = &Ce->ExpSizes;
  GrowToAccomodate(ChunkEMaxSzs, 4);
  // write the size of the exponent stream for current chunk
  WriteVarByte(ChunkEMaxSzs, Size(E->ChunkExpStream));
  array<u8>* ExpBuffer = &Ce->FileExpBuffer;
  // write the exponents to the exponent buffer for the whole file
  PushBack(ExpBuffer, E->ChunkExpStream.Stream.Data, Size(E->ChunkExpStream));
  //printf("%lld %lld\n", Size(E->ChunkExpStream), Size(*EMaxBuffer));
  u64 ChunkExpAddress = GetChunkAddress(Idx2, Sc->LastBrick, Level, Subband, ExponentBitPlane_);
  PushBack(&Ce->Addrs, ChunkExpAddress);
  Rewind(&E->ChunkExpStream);
}